

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCCof.c
# Opt level: O1

void Ccf_ManStop(Ccf_Man_t *p)

{
  Vec_Int_t *__ptr;
  
  __ptr = p->vCopies;
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr != (Vec_Int_t *)0x0) {
    free(__ptr);
  }
  Gia_ManUnrollStop(p->pUnr);
  sat_solver_delete(p->pSat);
  Gia_ManStopP(&p->pFrames);
  if (p != (Ccf_Man_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Ccf_ManStop( Ccf_Man_t * p )
{
    Vec_IntFree( p->vCopies );
    Gia_ManUnrollStop( p->pUnr );
    sat_solver_delete( p->pSat );
    Gia_ManStopP( &p->pFrames );
    ABC_FREE( p );
}